

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPSources::ProcessSDESNormalItem
          (RTPSources *this,uint32_t ssrc,ItemType t,size_t itemlength,void *itemdata,
          RTPTime *receivetime,RTPAddress *senderaddress)

{
  bool bVar1;
  int iVar2;
  uint8_t local_49;
  bool prevactive;
  uint8_t sdesid;
  int status;
  bool cnamecollis;
  bool created;
  RTPInternalSourceData *srcdat;
  RTPTime *receivetime_local;
  void *itemdata_local;
  size_t itemlength_local;
  ItemType t_local;
  uint32_t ssrc_local;
  RTPSources *this_local;
  
  switch(t) {
  case CNAME:
    local_49 = '\x01';
    break;
  case NAME:
    local_49 = '\x02';
    break;
  case EMAIL:
    local_49 = '\x03';
    break;
  case PHONE:
    local_49 = '\x04';
    break;
  case LOC:
    local_49 = '\x05';
    break;
  case TOOL:
    local_49 = '\x06';
    break;
  case NOTE:
    local_49 = '\a';
    break;
  default:
    return -0x43;
  }
  srcdat = (RTPInternalSourceData *)receivetime;
  receivetime_local = (RTPTime *)itemdata;
  itemdata_local = (void *)itemlength;
  itemlength_local._0_4_ = t;
  itemlength_local._4_4_ = ssrc;
  _t_local = this;
  this_local._4_4_ =
       GetRTCPSourceData(this,ssrc,senderaddress,(RTPInternalSourceData **)&status,(bool *)&sdesid);
  if (-1 < this_local._4_4_) {
    if (_status == (RTPInternalSourceData *)0x0) {
      this_local._4_4_ = 0;
    }
    else {
      bVar1 = RTPSourceData::IsActive(&_status->super_RTPSourceData);
      iVar2 = RTPInternalSourceData::ProcessSDESItem
                        (_status,local_49,(uint8_t *)receivetime_local,(size_t)itemdata_local,
                         (RTPTime *)srcdat,&prevactive);
      if ((!bVar1) && (bVar1 = RTPSourceData::IsActive(&_status->super_RTPSourceData), bVar1)) {
        this->activecount = this->activecount + 1;
      }
      if ((sdesid & 1) != 0) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,_status);
      }
      if ((prevactive & 1U) != 0) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[5])
                  (this,_status,senderaddress,receivetime_local,itemdata_local);
      }
      this_local._4_4_ = iVar2;
      if (-1 < iVar2) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0xd])
                  (this,_status,(ulong)(ItemType)itemlength_local,receivetime_local,itemdata_local);
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPSources::ProcessSDESNormalItem(uint32_t ssrc,RTCPSDESPacket::ItemType t,size_t itemlength,
                          const void *itemdata,const RTPTime &receivetime,const RTPAddress *senderaddress)
{
	RTPInternalSourceData *srcdat;
	bool created,cnamecollis;
	int status;
	uint8_t sdesid;
	bool prevactive;

	switch(t)
	{
	case RTCPSDESPacket::CNAME:
		sdesid = RTCP_SDES_ID_CNAME;
		break;
	case RTCPSDESPacket::NAME:
		sdesid = RTCP_SDES_ID_NAME;
		break;
	case RTCPSDESPacket::EMAIL:
		sdesid = RTCP_SDES_ID_EMAIL;
		break;
	case RTCPSDESPacket::PHONE:
		sdesid = RTCP_SDES_ID_PHONE;
		break;
	case RTCPSDESPacket::LOC:
		sdesid = RTCP_SDES_ID_LOCATION;
		break;
	case RTCPSDESPacket::TOOL:
		sdesid = RTCP_SDES_ID_TOOL;
		break;
	case RTCPSDESPacket::NOTE:
		sdesid = RTCP_SDES_ID_NOTE;
		break;
	default:
		return ERR_RTP_SOURCES_ILLEGALSDESTYPE;
	}	
	
	status = GetRTCPSourceData(ssrc,senderaddress,&srcdat,&created);
	if (status < 0)
		return status;
	if (srcdat == 0)
		return 0;

	prevactive = srcdat->IsActive();
	status = srcdat->ProcessSDESItem(sdesid,(const uint8_t *)itemdata,itemlength,receivetime,&cnamecollis);
	if (!prevactive && srcdat->IsActive())
		activecount++;
	
	// Call the callback
	if (created)
		OnNewSource(srcdat);
	if (cnamecollis)
		OnCNAMECollision(srcdat,senderaddress,(const uint8_t *)itemdata,itemlength);

	if (status >= 0)
		OnRTCPSDESItem(srcdat, t, itemdata, itemlength);
	
	return status;
}